

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmSetPropertyCommand::HandleDirectoryMode(cmSetPropertyCommand *this)

{
  ulong uVar1;
  bool bVar2;
  cmGlobalGenerator *this_00;
  cmMakefile *this_01;
  char *value;
  char *value_00;
  string dir;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  uVar1 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (uVar1 < 2) {
    if (uVar1 == 0) {
      this_01 = (this->super_cmCommand).Makefile;
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_50,
                 (string *)((this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1))
      ;
      bVar2 = cmsys::SystemTools::FileIsFullPath(&local_50);
      if (!bVar2) {
        cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
        std::__cxx11::string::_M_assign((string *)&local_50);
        std::__cxx11::string::append((char *)&local_50);
        std::__cxx11::string::append((string *)&local_50);
      }
      cmsys::SystemTools::CollapseFullPath(&local_30,&local_50);
      std::__cxx11::string::operator=((string *)&local_50,(string *)&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
      this_01 = cmGlobalGenerator::FindMakefile(this_00,&local_50);
      if (this_01 == (cmMakefile *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_30,
                   "DIRECTORY scope provided but requested directory was not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                   ,&local_51);
        cmCommand::SetError(&this->super_cmCommand,&local_30);
        std::__cxx11::string::~string((string *)&local_30);
        goto LAB_0027a19d;
      }
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (this->Remove == false) {
      value_00 = (this->PropertyValue)._M_dataplus._M_p;
    }
    else {
      value_00 = (char *)0x0;
    }
    if (this->AppendMode == true) {
      value = "";
      if (value_00 != (char *)0x0) {
        value = value_00;
      }
      cmMakefile::AppendProperty(this_01,&this->PropertyName,value,this->AppendAsString);
    }
    else {
      cmMakefile::SetProperty(this_01,&this->PropertyName,value_00);
    }
    bVar2 = true;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"allows at most one name for DIRECTORY scope.",
               (allocator<char> *)&local_30);
    cmCommand::SetError(&this->super_cmCommand,&local_50);
LAB_0027a19d:
    std::__cxx11::string::~string((string *)&local_50);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmSetPropertyCommand::HandleDirectoryMode()
{
  if (this->Names.size() > 1) {
    this->SetError("allows at most one name for DIRECTORY scope.");
    return false;
  }

  // Default to the current directory.
  cmMakefile* mf = this->Makefile;

  // Lookup the directory if given.
  if (!this->Names.empty()) {
    // Construct the directory name.  Interpret relative paths with
    // respect to the current directory.
    std::string dir = *this->Names.begin();
    if (!cmSystemTools::FileIsFullPath(dir)) {
      dir = this->Makefile->GetCurrentSourceDirectory();
      dir += "/";
      dir += *this->Names.begin();
    }

    // The local generators are associated with collapsed paths.
    dir = cmSystemTools::CollapseFullPath(dir);

    mf = this->Makefile->GetGlobalGenerator()->FindMakefile(dir);
    if (!mf) {
      // Could not find the directory.
      this->SetError(
        "DIRECTORY scope provided but requested directory was not found. "
        "This could be because the directory argument was invalid or, "
        "it is valid but has not been processed yet.");
      return false;
    }
  }

  // Set or append the property.
  std::string const& name = this->PropertyName;
  const char* value = this->PropertyValue.c_str();
  if (this->Remove) {
    value = nullptr;
  }
  if (this->AppendMode) {
    mf->AppendProperty(name, value ? value : "", this->AppendAsString);
  } else {
    mf->SetProperty(name, value);
  }

  return true;
}